

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_pass(REF_GRID ref_grid)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT rank;
  REF_INT found_nodes [27];
  REF_INT found;
  REF_INT cell_nodes [4];
  int local_e0;
  REF_INT node;
  REF_INT cell_face;
  REF_BOOL more_than_two;
  REF_INT faceid1;
  REF_INT faceid0;
  REF_INT tet1;
  REF_INT tet0;
  REF_INT face_nodes [4];
  int local_ac;
  REF_INT local_a8;
  REF_INT i;
  REF_INT tri_nodes [27];
  int local_34;
  REF_INT tri_index;
  REF_CELL tet;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_cell_00 = ref_grid->cell[8];
  local_34 = 0;
  do {
    if (ref_cell->max <= local_34) {
      return 0;
    }
    RVar4 = ref_cell_nodes(ref_cell,local_34,&local_a8);
    if (RVar4 == 0) {
      for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
        (&tet1)[local_ac] = (&local_a8)[local_ac];
      }
      face_nodes[1] = tet1;
      uVar5 = ref_cell_with_face(ref_cell_00,&tet1,&faceid0,&faceid1);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0xc6
               ,"ref_swap_pass",(ulong)uVar5,"unable to find tets with face");
        return uVar5;
      }
      if (faceid0 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",199,
               "ref_swap_pass","boundary tet missing");
        return 1;
      }
      if (faceid1 != -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",200,
               "ref_swap_pass","boundary tri has two tets, not manifold");
        return 1;
      }
      iVar1 = ref_grid->mpi->id;
      if ((((iVar1 == pRVar2->part[ref_cell_00->c2n[ref_cell_00->size_per * faceid0]]) &&
           (iVar1 == pRVar2->part[ref_cell_00->c2n[ref_cell_00->size_per * faceid0 + 1]])) &&
          (iVar1 == pRVar2->part[ref_cell_00->c2n[ref_cell_00->size_per * faceid0 + 2]])) &&
         (iVar1 == pRVar2->part[ref_cell_00->c2n[ref_cell_00->size_per * faceid0 + 3]])) {
        more_than_two = -1;
        cell_face = -1;
        bVar3 = false;
        for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
          for (cell_nodes[3] = 0; cell_nodes[3] < 4; cell_nodes[3] = cell_nodes[3] + 1) {
            found_nodes[(long)cell_nodes[3] + 0x1a] =
                 ref_cell_00->c2n
                 [ref_cell_00->f2n[cell_nodes[3] + local_e0 * 4] + ref_cell_00->size_per * faceid0];
          }
          RVar4 = ref_cell_with(ref_cell,found_nodes + 0x1a,found_nodes + 0x19);
          if (RVar4 == 0) {
            uVar5 = ref_cell_nodes(ref_cell,found_nodes[0x19],&ref_private_macro_code_rss);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0xd9,"ref_swap_pass",(ulong)uVar5,"tri");
              return uVar5;
            }
            if (more_than_two == -1) {
              more_than_two = found_nodes[1];
            }
            else {
              if (cell_face != -1) {
                bVar3 = true;
              }
              cell_face = found_nodes[1];
            }
          }
        }
        if (((more_than_two != -1) && (cell_face != -1)) &&
           ((more_than_two == cell_face &&
            ((!bVar3 && (uVar5 = ref_swap_remove_two_face_cell(ref_grid,faceid0), uVar5 != 0)))))) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0xe7,"ref_swap_pass",(ulong)uVar5,"remove it");
          return uVar5;
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_swap_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL tet = ref_grid_tet(ref_grid);
  REF_INT tri_index, tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, face_nodes[4];
  REF_INT tet0, tet1;
  REF_INT faceid0, faceid1;
  REF_BOOL more_than_two;
  REF_INT cell_face, node, cell_nodes[4];
  REF_INT found, found_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT rank;

  each_ref_cell_valid_cell_with_nodes(tri, tri_index, tri_nodes) {
    for (i = 0; i < 3; i++) face_nodes[i] = tri_nodes[i];
    face_nodes[3] = face_nodes[0];
    RSS(ref_cell_with_face(tet, face_nodes, &tet0, &tet1),
        "unable to find tets with face");
    if (REF_EMPTY == tet0) THROW("boundary tet missing");
    if (REF_EMPTY != tet1) THROW("boundary tri has two tets, not manifold");

    /* must be local to swap */
    rank = ref_mpi_rank(ref_grid_mpi(ref_grid));
    if (rank != ref_node_part(ref_node, ref_cell_c2n(tet, 0, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 1, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 2, tet0)) ||
        rank != ref_node_part(ref_node, ref_cell_c2n(tet, 3, tet0)))
      continue;

    faceid0 = REF_EMPTY;
    faceid1 = REF_EMPTY;
    more_than_two = REF_FALSE;
    for (cell_face = 0; cell_face < 4; cell_face++) {
      for (node = 0; node < 4; node++)
        cell_nodes[node] = ref_cell_f2n(tet, node, cell_face, tet0);
      if (REF_SUCCESS == ref_cell_with(tri, cell_nodes, &found)) {
        RSS(ref_cell_nodes(tri, found, found_nodes), "tri");
        if (REF_EMPTY == faceid0) {
          faceid0 = found_nodes[3];
        } else {
          if (REF_EMPTY != faceid1) {
            more_than_two = REF_TRUE;
          }
          faceid1 = found_nodes[3];
        }
      }
    }
    if (REF_EMPTY == faceid0 || REF_EMPTY == faceid1 || faceid0 != faceid1 ||
        more_than_two)
      continue;
    RSS(ref_swap_remove_two_face_cell(ref_grid, tet0), "remove it");
  }
  return REF_SUCCESS;
}